

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O0

void __thiscall
mtmd_context::mtmd_context
          (mtmd_context *this,char *mmproj_fname,llama_model *text_model,
          mtmd_context_params *ctx_params)

{
  uint uVar1;
  bool bVar2;
  llama_token lVar3;
  llama_token lVar4;
  llama_token lVar5;
  clip_ctx *pcVar6;
  runtime_error *this_00;
  undefined1 *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int minicpmv_version;
  clip_context_params ctx_clip_params;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  mtmd_context *in_stack_fffffffffffffd58;
  mtmd_context *this_01;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  clip_context_params in_stack_fffffffffffffd98;
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  int local_70;
  undefined1 local_69;
  string local_68 [32];
  ulong local_48;
  uint local_3c;
  undefined4 uStack_38;
  allocator<char> local_21;
  undefined1 *local_20;
  long local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x196ee8);
  *(byte *)(in_RDI + 5) = local_20[1] & 1;
  *(undefined4 *)((long)in_RDI + 0x2c) = *(undefined4 *)(local_20 + 4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (char *)in_stack_fffffffffffffd58,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  std::allocator<char>::~allocator(&local_21);
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 100) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xd) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0xffffffff;
  uVar1 = CONCAT31(local_3c._1_3_,*local_20);
  local_3c = uVar1 & 0xffffff01;
  uStack_38 = *(undefined4 *)(local_20 + 8);
  local_48 = CONCAT44(uStack_38,uVar1) & 0xffffffffffffff01;
  pcVar6 = clip_init((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd98);
  *in_RDI = (long)pcVar6;
  if (*in_RDI != 0) {
    in_RDI[1] = local_18;
    bVar2 = clip_is_qwen2vl((clip_ctx *)*in_RDI);
    if (bVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                 ,0x3d,"GGML_ASSERT(%s) failed",
                 "!clip_is_qwen2vl(ctx_clip) && \"Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead\""
                );
    }
    local_70 = clip_is_minicpmv((clip_ctx *)*in_RDI);
    if (local_70 == 2) {
      *(undefined4 *)(in_RDI + 10) = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 0x54) = lVar3;
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator(&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)(in_RDI + 0xb) = lVar3;
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 0x5c) = lVar3;
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)(in_RDI + 0xc) = lVar3;
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      *(undefined4 *)((long)in_RDI + 100) = *(undefined4 *)((long)in_RDI + 0x54);
      *(int *)(in_RDI + 0xd) = (int)in_RDI[0xb];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 0x6c) = lVar3;
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
    }
    else if ((local_70 == 3) || (local_70 == 4)) {
      *(undefined4 *)(in_RDI + 10) = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (char *)in_stack_fffffffffffffd58,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(in_stack_fffffffffffffd58,
                           (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 0x54) = lVar3;
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
      this_01 = (mtmd_context *)&stack0xfffffffffffffe7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(lVar3,in_stack_fffffffffffffd60),(char *)this_01,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      lVar4 = lookup_token(this_01,(string *)
                                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(llama_token *)(in_RDI + 0xb) = lVar4;
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(lVar3,in_stack_fffffffffffffd60),(char *)this_01,
                 (allocator<char> *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      lVar5 = lookup_token(this_01,(string *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 100) = lVar5;
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(lVar3,in_stack_fffffffffffffd60),(char *)this_01,
                 (allocator<char> *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      lVar5 = lookup_token(this_01,(string *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      *(llama_token *)(in_RDI + 0xd) = lVar5;
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(lVar3,in_stack_fffffffffffffd60),(char *)this_01,
                 (allocator<char> *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      lVar3 = lookup_token(this_01,(string *)CONCAT44(lVar4,in_stack_fffffffffffffd50));
      *(llama_token *)((long)in_RDI + 0x6c) = lVar3;
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
    }
    else if (local_70 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/mtmd.cpp"
                 ,0x57,"GGML_ASSERT(%s) failed","false && \"unsupported minicpmv version\"");
    }
    return;
  }
  local_69 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  string_format_abi_cxx11_((char *)local_68,"Failed to load CLIP model from %s\n",local_10);
  std::runtime_error::runtime_error(this_00,local_68);
  local_69 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

mtmd_context(const char * mmproj_fname,
                   const llama_model * text_model,
                   const mtmd_context_params & ctx_params) :
        print_timings(ctx_params.print_timings),
        n_threads    (ctx_params.n_threads),
        image_marker (ctx_params.image_marker)
    {
        clip_context_params ctx_clip_params;
        ctx_clip_params.use_gpu   = ctx_params.use_gpu;
        ctx_clip_params.verbosity = ctx_params.verbosity;
        ctx_clip = clip_init(mmproj_fname, ctx_clip_params);
        if (!ctx_clip) {
            throw std::runtime_error(string_format("Failed to load CLIP model from %s\n", mmproj_fname));
        }
        this->text_model = text_model;

        GGML_ASSERT(!clip_is_qwen2vl(ctx_clip) && "Qwen2VL model is not supported yet, use llama-qwen2vl-cli instead");

        int minicpmv_version = clip_is_minicpmv(ctx_clip);
        if (minicpmv_version == 2) {
            // minicpmv 2.5 format:
            // <image> (overview) </image><slice><image> (slice) </image><image> (slice) </image>\n ... </slice>
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_5;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_slices_start  = lookup_token("<slice>");
            tok_slices_end    = lookup_token("</slice>");
            tok_sli_img_start = tok_ov_img_start;
            tok_sli_img_end   = tok_ov_img_end;
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version == 3 || minicpmv_version == 4) {
            // minicpmv 2.6 format:
            // <image> (overview) </image><slice> (slice) </slice><slice> (slice) </slice>\n ...
            slice_tmpl        = MTMD_SLICE_TMPL_MINICPMV_2_6;
            tok_ov_img_start  = lookup_token("<image>");
            tok_ov_img_end    = lookup_token("</image>");
            tok_sli_img_start = lookup_token("<slice>");
            tok_sli_img_end   = lookup_token("</slice>");
            tok_row_end       = lookup_token("\n");

        } else if (minicpmv_version != 0) {
            GGML_ASSERT(false && "unsupported minicpmv version");
        }
    }